

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 6522Implementation.hpp
# Opt level: O0

ssize_t __thiscall
MOS::MOS6522::
MOS6522<Apple::Macintosh::ConcreteMachine<(Analyser::Static::Macintosh::Target::Model)3>::VIAPortHandler>
::write(MOS6522<Apple::Macintosh::ConcreteMachine<(Analyser::Static::Macintosh::Target::Model)3>::VIAPortHandler>
        *this,int __fd,void *__buf,size_t __n)

{
  VIAPortHandler *pVVar1;
  bool bVar2;
  byte bVar3;
  uint uVar4;
  MOS6522<Apple::Macintosh::ConcreteMachine<(Analyser::Static::Macintosh::Target::Model)3>::VIAPortHandler>
  *pMVar5;
  MOS6522<Apple::Macintosh::ConcreteMachine<(Analyser::Static::Macintosh::Target::Model)3>::VIAPortHandler>
  *extraout_RAX;
  HalfCycles HVar6;
  MOS6522<Apple::Macintosh::ConcreteMachine<(Analyser::Static::Macintosh::Target::Model)3>::VIAPortHandler>
  *extraout_RAX_00;
  MOS6522<Apple::Macintosh::ConcreteMachine<(Analyser::Static::Macintosh::Target::Model)3>::VIAPortHandler>
  *extraout_RAX_01;
  MOS6522<Apple::Macintosh::ConcreteMachine<(Analyser::Static::Macintosh::Target::Model)3>::VIAPortHandler>
  *extraout_RAX_02;
  MOS6522<Apple::Macintosh::ConcreteMachine<(Analyser::Static::Macintosh::Target::Model)3>::VIAPortHandler>
  *extraout_RAX_03;
  MOS6522<Apple::Macintosh::ConcreteMachine<(Analyser::Static::Macintosh::Target::Model)3>::VIAPortHandler>
  *extraout_RAX_04;
  MOS6522<Apple::Macintosh::ConcreteMachine<(Analyser::Static::Macintosh::Target::Model)3>::VIAPortHandler>
  *extraout_RAX_05;
  MOS6522<Apple::Macintosh::ConcreteMachine<(Analyser::Static::Macintosh::Target::Model)3>::VIAPortHandler>
  *extraout_RAX_06;
  byte bVar7;
  Port local_30;
  int port;
  int shift;
  uint8_t value_local;
  int address_local;
  MOS6522<Apple::Macintosh::ConcreteMachine<(Analyser::Static::Macintosh::Target::Model)3>::VIAPortHandler>
  *this_local;
  
  bVar7 = (byte)__buf;
  uVar4 = __fd & 0xf;
  access(this,(char *)(ulong)uVar4,(int)__buf);
  pMVar5 = (MOS6522<Apple::Macintosh::ConcreteMachine<(Analyser::Static::Macintosh::Target::Model)3>::VIAPortHandler>
            *)((ulong)uVar4 - 0xf);
  if ((ulong)uVar4 < 0xf ||
      pMVar5 == (MOS6522<Apple::Macintosh::ConcreteMachine<(Analyser::Static::Macintosh::Target::Model)3>::VIAPortHandler>
                 *)0x0) {
    pMVar5 = this;
    switch(uVar4) {
    case 0:
      (this->super_MOS6522Storage).registers_.output[1] = bVar7;
      pVVar1 = this->bus_handler_;
      HVar6 = WrappedInt<HalfCycles>::flush<HalfCycles>
                        (&(this->time_since_bus_handler_call_).super_WrappedInt<HalfCycles>);
      Apple::Macintosh::ConcreteMachine<(Analyser::Static::Macintosh::Target::Model)3>::
      VIAPortHandler::run_for(pVVar1,HVar6);
      evaluate_port_b_output(this);
      bVar7 = 8;
      if (((this->super_MOS6522Storage).registers_.peripheral_control & 0x20) != 0) {
        bVar7 = 0;
      }
      (this->super_MOS6522Storage).registers_.interrupt_flags =
           (this->super_MOS6522Storage).registers_.interrupt_flags & ((bVar7 | 0x10) ^ 0xff);
      reevaluate_interrupts(this);
      pMVar5 = extraout_RAX;
      break;
    default:
      (this->super_MOS6522Storage).registers_.output[0] = bVar7;
      pVVar1 = this->bus_handler_;
      HVar6 = WrappedInt<HalfCycles>::flush<HalfCycles>
                        (&(this->time_since_bus_handler_call_).super_WrappedInt<HalfCycles>);
      Apple::Macintosh::ConcreteMachine<(Analyser::Static::Macintosh::Target::Model)3>::
      VIAPortHandler::run_for(pVVar1,HVar6);
      Apple::Macintosh::ConcreteMachine<(Analyser::Static::Macintosh::Target::Model)3>::
      VIAPortHandler::set_port_output
                (this->bus_handler_,A,bVar7,
                 (this->super_MOS6522Storage).registers_.data_direction[0]);
      if ((this->super_MOS6522Storage).handshake_modes_[1] != None) {
        set_control_line_output(this,A,Two,Off);
      }
      bVar7 = 8;
      if (((this->super_MOS6522Storage).registers_.peripheral_control & 2) != 0) {
        bVar7 = 0;
      }
      (this->super_MOS6522Storage).registers_.interrupt_flags =
           (this->super_MOS6522Storage).registers_.interrupt_flags & ((bVar7 | 2) ^ 0xff);
      reevaluate_interrupts(this);
      pMVar5 = extraout_RAX_00;
      break;
    case 2:
      (this->super_MOS6522Storage).registers_.data_direction[1] = bVar7;
      break;
    case 3:
      (this->super_MOS6522Storage).registers_.data_direction[0] = bVar7;
      break;
    case 4:
    case 6:
      (this->super_MOS6522Storage).registers_.timer_latch[0] =
           (this->super_MOS6522Storage).registers_.timer_latch[0] & 0xff00 | (ushort)bVar7;
      break;
    case 5:
      (this->super_MOS6522Storage).registers_.timer_latch[0] =
           (this->super_MOS6522Storage).registers_.timer_latch[0] & 0xff | (ushort)bVar7 << 8;
      (this->super_MOS6522Storage).registers_.next_timer[0] =
           (uint)(this->super_MOS6522Storage).registers_.timer_latch[0];
      (this->super_MOS6522Storage).timer_is_running_[0] = true;
      bVar2 = MOS6522Storage::timer1_is_controlling_pb7(&this->super_MOS6522Storage);
      if (bVar2) {
        (this->super_MOS6522Storage).registers_.timer_port_b_output =
             (this->super_MOS6522Storage).registers_.timer_port_b_output & 0x7f;
        evaluate_port_b_output(this);
      }
      (this->super_MOS6522Storage).registers_.interrupt_flags =
           (this->super_MOS6522Storage).registers_.interrupt_flags & 0xbf;
      reevaluate_interrupts(this);
      pMVar5 = extraout_RAX_01;
      break;
    case 7:
      (this->super_MOS6522Storage).registers_.timer_latch[0] =
           (this->super_MOS6522Storage).registers_.timer_latch[0] & 0xff | (ushort)bVar7 << 8;
      break;
    case 8:
      (this->super_MOS6522Storage).registers_.timer_latch[1] = (ushort)bVar7;
      break;
    case 9:
      (this->super_MOS6522Storage).registers_.interrupt_flags =
           (this->super_MOS6522Storage).registers_.interrupt_flags & 0xdf;
      (this->super_MOS6522Storage).registers_.next_timer[1] =
           (uint)(this->super_MOS6522Storage).registers_.timer_latch[1] |
           (uint)(((ulong)__buf & 0xff) << 8);
      (this->super_MOS6522Storage).timer_is_running_[1] = true;
      reevaluate_interrupts(this);
      pMVar5 = extraout_RAX_02;
      break;
    case 10:
      (this->super_MOS6522Storage).registers_.shift = bVar7;
      (this->super_MOS6522Storage).shift_bits_remaining_ = 8;
      (this->super_MOS6522Storage).registers_.interrupt_flags =
           (this->super_MOS6522Storage).registers_.interrupt_flags & 0xfb;
      reevaluate_interrupts(this);
      pMVar5 = extraout_RAX_03;
      break;
    case 0xb:
      (this->super_MOS6522Storage).registers_.auxiliary_control = bVar7;
      evaluate_cb2_output(this);
      bVar2 = MOS6522Storage::timer1_is_controlling_pb7(&this->super_MOS6522Storage);
      if (!bVar2) {
        (this->super_MOS6522Storage).registers_.timer_port_b_output =
             (this->super_MOS6522Storage).registers_.timer_port_b_output | 0x80;
      }
      evaluate_port_b_output(this);
      pMVar5 = extraout_RAX_04;
      break;
    case 0xc:
      (this->super_MOS6522Storage).registers_.peripheral_control = bVar7;
      bVar3 = 0;
      local_30 = A;
      while ((int)local_30 < 2) {
        (this->super_MOS6522Storage).handshake_modes_[(int)local_30] = None;
        switch(bVar7 >> (bVar3 & 0x1f) & 0xe) {
        case 0:
        case 2:
        case 4:
        case 6:
          set_control_line_output(this,local_30,Two,Input);
          break;
        case 8:
          (this->super_MOS6522Storage).handshake_modes_[(int)local_30] = Handshake;
          set_control_line_output(this,local_30,Two,Off);
          break;
        case 10:
          (this->super_MOS6522Storage).handshake_modes_[(int)local_30] = Pulse;
          set_control_line_output(this,local_30,Two,On);
          break;
        case 0xc:
          set_control_line_output(this,local_30,Two,Off);
          break;
        case 0xe:
          set_control_line_output(this,local_30,Two,On);
        }
        bVar3 = bVar3 + 4;
        local_30 = local_30 + B;
        pMVar5 = (MOS6522<Apple::Macintosh::ConcreteMachine<(Analyser::Static::Macintosh::Target::Model)3>::VIAPortHandler>
                  *)(ulong)local_30;
      }
      break;
    case 0xd:
      (this->super_MOS6522Storage).registers_.interrupt_flags =
           (this->super_MOS6522Storage).registers_.interrupt_flags & (bVar7 ^ 0xff);
      reevaluate_interrupts(this);
      pMVar5 = extraout_RAX_05;
      break;
    case 0xe:
      if (((ulong)__buf & 0x80) == 0) {
        (this->super_MOS6522Storage).registers_.interrupt_enable =
             (this->super_MOS6522Storage).registers_.interrupt_enable & (bVar7 ^ 0xff);
      }
      else {
        (this->super_MOS6522Storage).registers_.interrupt_enable =
             (this->super_MOS6522Storage).registers_.interrupt_enable | bVar7;
      }
      reevaluate_interrupts(this);
      pMVar5 = extraout_RAX_06;
    }
  }
  return (ssize_t)pMVar5;
}

Assistant:

void MOS6522<T>::write(int address, uint8_t value) {
	address &= 0xf;
	access(address);
	switch(address) {
		case 0x0:	// Write Port B. ('ORB')
			// Store locally and communicate outwards.
			registers_.output[1] = value;

			bus_handler_.run_for(time_since_bus_handler_call_.flush<HalfCycles>());
			evaluate_port_b_output();

			registers_.interrupt_flags &= ~(InterruptFlag::CB1ActiveEdge | ((registers_.peripheral_control&0x20) ? 0 : InterruptFlag::CB2ActiveEdge));
			reevaluate_interrupts();
		break;
		case 0xf:
		case 0x1:	// Write Port A. ('ORA')
			registers_.output[0] = value;

			bus_handler_.run_for(time_since_bus_handler_call_.flush<HalfCycles>());
			bus_handler_.set_port_output(Port::A, value, registers_.data_direction[0]);

			if(handshake_modes_[1] != HandshakeMode::None) {
				set_control_line_output(Port::A, Line::Two, LineState::Off);
			}

			registers_.interrupt_flags &= ~(InterruptFlag::CA1ActiveEdge | ((registers_.peripheral_control&0x02) ? 0 : InterruptFlag::CB2ActiveEdge));
			reevaluate_interrupts();
		break;

		case 0x2:	// Port B direction ('DDRB').
			registers_.data_direction[1] = value;
		break;
		case 0x3:	// Port A direction ('DDRA').
			registers_.data_direction[0] = value;
		break;

		// Timer 1
		case 0x6:	case 0x4:	// ('T1L-L' and 'T1C-L')
			registers_.timer_latch[0] = (registers_.timer_latch[0]&0xff00) | value;
		break;
		case 0x7:	// Timer 1 latch, high ('T1L-H').
			registers_.timer_latch[0] = (registers_.timer_latch[0]&0x00ff) | uint16_t(value << 8);
		break;
		case 0x5:	// Timer 1 counter, high ('T1C-H').
			// Fill latch.
			registers_.timer_latch[0] = (registers_.timer_latch[0]&0x00ff) | uint16_t(value << 8);

			// Restart timer.
			registers_.next_timer[0] = registers_.timer_latch[0];
			timer_is_running_[0] = true;

			// If PB7 output mode is active, set it low.
			if(timer1_is_controlling_pb7()) {
				registers_.timer_port_b_output &= 0x7f;
				evaluate_port_b_output();
			}

			// Clear existing interrupt flag.
			registers_.interrupt_flags &= ~InterruptFlag::Timer1;
			reevaluate_interrupts();
		break;

		// Timer 2
		case 0x8:	// ('T2C-L')
			registers_.timer_latch[1] = value;
		break;
		case 0x9:	// ('T2C-H')
			registers_.interrupt_flags &= ~InterruptFlag::Timer2;
			registers_.next_timer[1] = registers_.timer_latch[1] | uint16_t(value << 8);
			timer_is_running_[1] = true;
			reevaluate_interrupts();
		break;

		// Shift
		case 0xa:	// ('SR')
			registers_.shift = value;
			shift_bits_remaining_ = 8;
			registers_.interrupt_flags &= ~InterruptFlag::ShiftRegister;
			reevaluate_interrupts();
		break;

		// Control
		case 0xb:	// Auxiliary control ('ACR').
			registers_.auxiliary_control = value;
			evaluate_cb2_output();

			// This is a bit of a guess: reset the timer-based PB7 output to its default high level
			// any timer that timer-linked PB7 output is disabled.
			if(!timer1_is_controlling_pb7()) {
				registers_.timer_port_b_output |= 0x80;
			}
			evaluate_port_b_output();
		break;
		case 0xc: {	// Peripheral control ('PCR').
//			const auto old_peripheral_control = registers_.peripheral_control;
			registers_.peripheral_control = value;

			int shift = 0;
			for(int port = 0; port < 2; ++port) {
				handshake_modes_[port] = HandshakeMode::None;
				switch((value >> shift) & 0x0e) {
					default: break;

					case 0x00:	// Negative interrupt input; set Cx2 interrupt on negative Cx2 transition, clear on access to Port x register.
					case 0x02:	// Independent negative interrupt input; set Cx2 interrupt on negative transition, don't clear automatically.
					case 0x04:	// Positive interrupt input; set Cx2 interrupt on positive Cx2 transition, clear on access to Port x register.
					case 0x06:	// Independent positive interrupt input; set Cx2 interrupt on positive transition, don't clear automatically.
						set_control_line_output(Port(port), Line::Two, LineState::Input);
					break;

					case 0x08:	// Handshake: set Cx2 to low on any read or write of Port x; set to high on an active transition of Cx1.
						handshake_modes_[port] = HandshakeMode::Handshake;
						set_control_line_output(Port(port), Line::Two, LineState::Off);	// At a guess.
					break;

					case 0x0a:	// Pulse output: Cx2 is low for one cycle following a read or write of Port x.
						handshake_modes_[port] = HandshakeMode::Pulse;
						set_control_line_output(Port(port), Line::Two, LineState::On);
					break;

					case 0x0c:	// Manual output: Cx2 low.
						set_control_line_output(Port(port), Line::Two, LineState::Off);
					break;

					case 0x0e:	// Manual output: Cx2 high.
						set_control_line_output(Port(port), Line::Two, LineState::On);
					break;
				}

				shift += 4;
			}
		} break;

		// Interrupt control
		case 0xd:	// Interrupt flag regiser ('IFR').
			registers_.interrupt_flags &= ~value;
			reevaluate_interrupts();
		break;
		case 0xe:	// Interrupt enable register ('IER').
			if(value&0x80)
				registers_.interrupt_enable |= value;
			else
				registers_.interrupt_enable &= ~value;
			reevaluate_interrupts();
		break;
	}
}